

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecmult_target(secp256k1_scalar *target,int mode)

{
  undefined1 *puVar1;
  int iVar2;
  secp256k1_scratch_space *scratch;
  long lVar3;
  ulong uVar4;
  code *pcVar5;
  secp256k1_ge *psVar6;
  long extraout_RDX;
  secp256k1_ge *scratch_00;
  size_t sVar7;
  secp256k1_gej *r;
  ulong uVar8;
  secp256k1_strauss_point_state *psVar9;
  uchar *out32;
  secp256k1_sha256 *psVar10;
  secp256k1_gej *psVar11;
  secp256k1_ge *b;
  secp256k1_gej *psVar12;
  secp256k1_gej *psVar13;
  code *cb;
  secp256k1_ge *cbdata;
  secp256k1_fe *unaff_R12;
  secp256k1_callback *error_callback;
  secp256k1_sha256 *hash;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *psVar14;
  secp256k1_sha256 *psVar15;
  secp256k1_scalar n2;
  secp256k1_scalar n1;
  secp256k1_gej ptj;
  secp256k1_gej p2j;
  secp256k1_gej p1j;
  secp256k1_ge p;
  secp256k1_gej pj;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  ulong uStack_2380;
  secp256k1_strauss_state sStack_2378;
  secp256k1_strauss_point_state sStack_2360;
  secp256k1_fe asStack_1f50 [8];
  secp256k1_ge asStack_1dd0 [8];
  secp256k1_gej *psStack_1a88;
  secp256k1_callback *psStack_1a80;
  secp256k1_ge *psStack_1a70;
  secp256k1_strauss_point_state *psStack_1a68;
  secp256k1_scalar *psStack_1a60;
  undefined1 auStack_1a48 [8];
  undefined1 auStack_1a40 [176];
  secp256k1_gej sStack_1990;
  secp256k1_gej sStack_18f8;
  secp256k1_gej sStack_1860;
  secp256k1_gej sStack_17c8;
  secp256k1_gej sStack_1730;
  secp256k1_gej asStack_1698 [2];
  secp256k1_gej asStack_1518 [5];
  secp256k1_strauss_point_state sStack_11d8;
  secp256k1_scratch_space *psStack_dc0;
  secp256k1_sha256 *psStack_db8;
  undefined1 *puStack_db0;
  secp256k1_gej *psStack_da8;
  secp256k1_gej *psStack_da0;
  code *pcStack_d98;
  undefined4 uStack_d86;
  undefined2 uStack_d82;
  secp256k1_gej *psStack_d80;
  long lStack_d78;
  undefined1 auStack_d70 [40];
  undefined8 uStack_d48;
  uint64_t uStack_d40;
  uint64_t uStack_d38;
  secp256k1_sha256 sStack_d30;
  secp256k1_sha256 sStack_cc0;
  secp256k1_gej *psStack_c58;
  secp256k1_fe *psStack_c50;
  secp256k1_ge *psStack_c48;
  secp256k1_ge *psStack_c40;
  secp256k1_gej *psStack_c38;
  secp256k1_strauss_point_state *psStack_c30;
  undefined1 auStack_c28 [32];
  undefined1 local_c08 [40];
  secp256k1_ge *local_be0;
  secp256k1_strauss_point_state *local_bd8;
  secp256k1_gej local_bd0;
  secp256k1_gej local_b38;
  secp256k1_gej local_aa0;
  secp256k1_ge local_a08;
  secp256k1_gej local_9a0;
  secp256k1_fe local_908 [8];
  secp256k1_ge local_788 [8];
  secp256k1_strauss_point_state local_448;
  
  psVar13 = (secp256k1_gej *)auStack_c28;
  psVar9 = (secp256k1_strauss_point_state *)(ulong)(uint)mode;
  psVar14 = (secp256k1_scalar *)local_c08;
  psStack_c30 = (secp256k1_strauss_point_state *)0x14d70a;
  testutil_random_scalar_order_test(psVar14);
  psStack_c30 = (secp256k1_strauss_point_state *)0x14d71b;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_c28,psVar14,target);
  psStack_c30 = (secp256k1_strauss_point_state *)0x14d726;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_c28,(secp256k1_scalar *)auStack_c28);
  if (mode == 0) {
    psStack_c30 = (secp256k1_strauss_point_state *)0x14d81f;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_aa0,(secp256k1_scalar *)local_c08);
    psStack_c30 = (secp256k1_strauss_point_state *)0x14d836;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_b38,(secp256k1_scalar *)auStack_c28);
    psStack_c30 = (secp256k1_strauss_point_state *)0x14d84a;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_bd0,target);
  }
  else {
    psStack_c30 = (secp256k1_strauss_point_state *)0x14d73e;
    testutil_random_ge_test(&local_a08);
    psStack_c30 = (secp256k1_strauss_point_state *)0x14d74e;
    secp256k1_gej_set_ge(&local_9a0,&local_a08);
    if (mode == 1) {
      unaff_R12 = local_908;
      unaff_R13 = local_788;
      psVar9 = &local_448;
      psVar14 = &secp256k1_scalar_zero;
      psStack_c30 = (secp256k1_strauss_point_state *)0x14d7ae;
      local_b38.x.n[0] = (uint64_t)unaff_R12;
      local_b38.x.n[1] = (uint64_t)unaff_R13;
      local_b38.x.n[2] = (uint64_t)psVar9;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_b38,&local_aa0,1,&local_9a0,
                 (secp256k1_scalar *)local_c08,&secp256k1_scalar_zero);
      psStack_c30 = (secp256k1_strauss_point_state *)0x14d7d9;
      local_bd0.x.n[0] = (uint64_t)unaff_R12;
      local_bd0.x.n[1] = (uint64_t)unaff_R13;
      local_bd0.x.n[2] = (uint64_t)psVar9;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_bd0,&local_b38,1,&local_9a0,
                 (secp256k1_scalar *)auStack_c28,&secp256k1_scalar_zero);
      psStack_c30 = (secp256k1_strauss_point_state *)0x14d801;
      local_c08._32_8_ = unaff_R12;
      local_be0 = unaff_R13;
      local_bd8 = psVar9;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(local_c08 + 0x20),&local_bd0,1,&local_9a0,target,
                 &secp256k1_scalar_zero);
      psVar13 = &local_9a0;
    }
    else {
      psVar14 = (secp256k1_scalar *)&local_a08;
      psStack_c30 = (secp256k1_strauss_point_state *)0x14d869;
      secp256k1_ecmult_const(&local_aa0,(secp256k1_ge *)psVar14,(secp256k1_scalar *)local_c08);
      psStack_c30 = (secp256k1_strauss_point_state *)0x14d87c;
      secp256k1_ecmult_const(&local_b38,(secp256k1_ge *)psVar14,(secp256k1_scalar *)auStack_c28);
      psStack_c30 = (secp256k1_strauss_point_state *)0x14d88c;
      secp256k1_ecmult_const(&local_bd0,(secp256k1_ge *)psVar14,target);
      psVar13 = (secp256k1_gej *)auStack_c28;
    }
  }
  psStack_c30 = (secp256k1_strauss_point_state *)0x14d8a6;
  secp256k1_gej_add_var(&local_bd0,&local_bd0,&local_aa0,(secp256k1_fe *)0x0);
  psStack_c30 = (secp256k1_strauss_point_state *)0x14d8bb;
  psVar11 = &local_bd0;
  secp256k1_gej_add_var(&local_bd0,&local_bd0,&local_b38,(secp256k1_fe *)0x0);
  psStack_c30 = (secp256k1_strauss_point_state *)0x14d8c3;
  psVar12 = &local_bd0;
  secp256k1_gej_verify(&local_bd0);
  if (local_bd0.infinity != 0) {
    return;
  }
  psStack_c30 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (uchar *)((ulong)psVar12 & 0xffffffff);
  pcStack_d98 = (code *)0x14d911;
  psStack_d80 = psVar11;
  lStack_d78 = extraout_RDX;
  psStack_c58 = &local_bd0;
  psStack_c50 = unaff_R12;
  psStack_c48 = unaff_R13;
  psStack_c40 = (secp256k1_ge *)psVar14;
  psStack_c38 = psVar13;
  psStack_c30 = psVar9;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_d86 = SUB84(psVar12,0);
  psVar15 = &sStack_cc0;
  sStack_cc0.s[0] = 0x6a09e667;
  sStack_cc0.s[1] = 0xbb67ae85;
  sStack_cc0.s[2] = 0x3c6ef372;
  sStack_cc0.s[3] = 0xa54ff53a;
  sStack_cc0.s[4] = 0x510e527f;
  sStack_cc0.s[5] = 0x9b05688c;
  sStack_cc0.s[6] = 0x1f83d9ab;
  sStack_cc0.s[7] = 0x5be0cd19;
  psVar11 = (secp256k1_gej *)0x0;
  sStack_cc0.bytes = 0;
  psVar14 = (secp256k1_scalar *)(auStack_d70 + 0x20);
  auStack_d70._32_8_ = 0;
  uStack_d48._0_4_ = 0;
  uStack_d48._4_4_ = 0;
  uStack_d40 = 0;
  uStack_d38 = 0;
  pcStack_d98 = (code *)0x14d95b;
  secp256k1_scalar_verify(psVar14);
  pcStack_d98 = (code *)0x14d969;
  test_ecmult_accumulate(psVar15,psVar14,scratch);
  auStack_d70._32_8_ = 1;
  uStack_d48._0_4_ = 0;
  uStack_d48._4_4_ = 0;
  uStack_d40 = 0;
  uStack_d38 = 0;
  pcStack_d98 = (code *)0x14d985;
  secp256k1_scalar_verify(psVar14);
  pcStack_d98 = (code *)0x14d993;
  test_ecmult_accumulate(psVar15,psVar14,scratch);
  pcStack_d98 = (code *)0x14d99e;
  secp256k1_scalar_negate(psVar14,psVar14);
  pcStack_d98 = (code *)0x14d9af;
  test_ecmult_accumulate(psVar15,psVar14,scratch);
  psVar13 = psStack_d80;
  if (psStack_d80 != (secp256k1_gej *)0x0) {
    psVar11 = (secp256k1_gej *)0x0;
    psVar15 = &sStack_d30;
    out32 = auStack_d70;
    do {
      uStack_d82 = SUB82(psVar11,0);
      sStack_d30.s[0] = 0x6a09e667;
      sStack_d30.s[1] = 0xbb67ae85;
      sStack_d30.s[2] = 0x3c6ef372;
      sStack_d30.s[3] = 0xa54ff53a;
      sStack_d30.s[4] = 0x510e527f;
      sStack_d30.s[5] = 0x9b05688c;
      sStack_d30.s[6] = 0x1f83d9ab;
      sStack_d30.s[7] = 0x5be0cd19;
      sStack_d30.bytes = 0;
      pcStack_d98 = (code *)0x14da0b;
      secp256k1_sha256_write(psVar15,(uchar *)&uStack_d86,6);
      pcStack_d98 = (code *)0x14da16;
      secp256k1_sha256_finalize(psVar15,out32);
      pcStack_d98 = (code *)0x14da23;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(auStack_d70 + 0x20),out32,(int *)0x0);
      pcStack_d98 = (code *)0x14da36;
      test_ecmult_accumulate(&sStack_cc0,(secp256k1_scalar *)(auStack_d70 + 0x20),scratch);
      psVar11 = (secp256k1_gej *)((long)(psVar11->x).n + 1);
    } while (psVar13 != psVar11);
  }
  hash = &sStack_cc0;
  psVar6 = (secp256k1_ge *)auStack_d70;
  pcStack_d98 = (code *)0x14da50;
  secp256k1_sha256_finalize(hash,(uchar *)psVar6);
  lVar3 = 0;
  while (auStack_d70[lVar3] == *(char *)(lStack_d78 + lVar3)) {
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x20) {
      pcStack_d98 = (code *)0x14da78;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return;
    }
  }
  pcStack_d98 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_da0 = psVar13;
  auStack_1a48 = (undefined1  [8])0x41;
  psStack_1a60 = (secp256k1_scalar *)0x14dac8;
  psStack_dc0 = scratch;
  psStack_db8 = psVar15;
  puStack_db0 = auStack_d70 + 0x20;
  psStack_da8 = psVar11;
  pcStack_d98 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_1860,&secp256k1_ge_const_g);
  psStack_1a60 = (secp256k1_scalar *)0x14dad5;
  secp256k1_gej_set_infinity(&sStack_18f8);
  psStack_1a60 = (secp256k1_scalar *)0x14daec;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_17c8 + 1,(secp256k1_scalar *)psVar6);
  psVar9 = (secp256k1_strauss_point_state *)(asStack_1518[5].y.n + 3);
  psStack_1a60 = (secp256k1_scalar *)0x14db3e;
  sStack_1990.x.n[0] = (uint64_t)asStack_1698;
  sStack_1990.x.n[1] = (uint64_t)asStack_1518;
  sStack_1990.x.n[2] = (uint64_t)psVar9;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1990,&sStack_17c8,1,&sStack_1860,
             (secp256k1_scalar *)psVar6,&secp256k1_scalar_zero);
  psStack_1a60 = (secp256k1_scalar *)0x14db6e;
  auStack_1a40._0_8_ = asStack_1698;
  auStack_1a40._8_8_ = asStack_1518;
  auStack_1a40._16_8_ = psVar9;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_1a40,&sStack_1990,1,&sStack_18f8,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar6);
  error_callback = (secp256k1_callback *)0xd0;
  psVar13 = (secp256k1_gej *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_ge *)0x0;
  psStack_1a60 = (secp256k1_scalar *)0x14db9f;
  psVar14 = (secp256k1_scalar *)psVar6;
  b = scratch_00;
  iVar2 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)psVar13,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)(asStack_1518[5].y.n + 3),(secp256k1_scalar *)psVar6,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar2 == 0) {
    psStack_1a60 = (secp256k1_scalar *)0x14dd04;
    test_ecmult_accumulate_cold_8();
LAB_0014dd04:
    psStack_1a60 = (secp256k1_scalar *)0x14dd09;
    test_ecmult_accumulate_cold_7();
LAB_0014dd09:
    psStack_1a60 = (secp256k1_scalar *)0x14dd0e;
    test_ecmult_accumulate_cold_6();
LAB_0014dd0e:
    psStack_1a60 = (secp256k1_scalar *)0x14dd13;
    test_ecmult_accumulate_cold_5();
LAB_0014dd13:
    psStack_1a60 = (secp256k1_scalar *)0x14dd18;
    test_ecmult_accumulate_cold_4();
LAB_0014dd18:
    psStack_1a60 = (secp256k1_scalar *)0x14dd1d;
    test_ecmult_accumulate_cold_3();
LAB_0014dd1d:
    psStack_1a60 = (secp256k1_scalar *)0x14dd22;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar14 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_1a60 = (secp256k1_scalar *)0x14dbda;
    b = scratch_00;
    psVar13 = (secp256k1_gej *)error_callback;
    cbdata = psVar6;
    iVar2 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_1518,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar6,1);
    if (iVar2 == 0) goto LAB_0014dd04;
    psStack_1a60 = (secp256k1_scalar *)0x14dbf9;
    secp256k1_ecmult_const(asStack_1698,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar6);
    psVar6 = (secp256k1_ge *)auStack_1a40;
    psStack_1a60 = (secp256k1_scalar *)0x14dc0e;
    secp256k1_ge_set_gej_var(psVar6,&sStack_17c8 + 1);
    psVar13 = &sStack_17c8;
    psStack_1a60 = (secp256k1_scalar *)0x14dc1e;
    b = psVar6;
    iVar2 = secp256k1_gej_eq_ge_var(psVar13,psVar6);
    if (iVar2 == 0) goto LAB_0014dd09;
    psVar13 = &sStack_1990;
    b = (secp256k1_ge *)auStack_1a40;
    psStack_1a60 = (secp256k1_scalar *)0x14dc38;
    iVar2 = secp256k1_gej_eq_ge_var(psVar13,b);
    if (iVar2 == 0) goto LAB_0014dd0e;
    psVar13 = (secp256k1_gej *)(asStack_1518[5].y.n + 3);
    b = (secp256k1_ge *)auStack_1a40;
    psStack_1a60 = (secp256k1_scalar *)0x14dc52;
    iVar2 = secp256k1_gej_eq_ge_var(psVar13,b);
    if (iVar2 == 0) goto LAB_0014dd13;
    psVar13 = asStack_1518;
    b = (secp256k1_ge *)auStack_1a40;
    psStack_1a60 = (secp256k1_scalar *)0x14dc6c;
    iVar2 = secp256k1_gej_eq_ge_var(psVar13,b);
    if (iVar2 == 0) goto LAB_0014dd18;
    psVar13 = asStack_1698;
    b = (secp256k1_ge *)auStack_1a40;
    psStack_1a60 = (secp256k1_scalar *)0x14dc86;
    iVar2 = secp256k1_gej_eq_ge_var(psVar13,b);
    if (iVar2 == 0) goto LAB_0014dd1d;
    psStack_1a60 = (secp256k1_scalar *)0x14dc9b;
    secp256k1_ge_verify((secp256k1_ge *)auStack_1a40);
    if (auStack_1a40._96_4_ != 0) {
      auStack_1a40[0x68] = 0;
      sVar7 = 1;
LAB_0014dce3:
      psStack_1a60 = (secp256k1_scalar *)0x14dced;
      secp256k1_sha256_write(hash,auStack_1a40 + 0x68,sVar7);
      return;
    }
    psVar13 = (secp256k1_gej *)auStack_1a40;
    b = (secp256k1_ge *)(auStack_1a40 + 0x68);
    psVar6 = (secp256k1_ge *)auStack_1a48;
    psVar14 = (secp256k1_scalar *)0x0;
    psStack_1a60 = (secp256k1_scalar *)0x14dcd0;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar13,(uchar *)b,(size_t *)psVar6,0);
    if (auStack_1a48 == (undefined1  [8])0x41) {
      sVar7 = 0x41;
      goto LAB_0014dce3;
    }
  }
  psStack_1a60 = (secp256k1_scalar *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  psStack_1a60 = &secp256k1_scalar_zero;
  psStack_1a88 = asStack_1698;
  psStack_1a80 = error_callback;
  psStack_1a70 = psVar6;
  psStack_1a68 = psVar9;
  secp256k1_gej_set_infinity(r);
  if ((secp256k1_ge *)psVar14 != (secp256k1_ge *)0x0 || hash != (secp256k1_sha256 *)0x0) {
    if (hash == (secp256k1_sha256 *)0x0) {
      sStack_2378.aux = asStack_1f50;
      sStack_2378.pre_a = asStack_1dd0;
      sStack_2378.ps = &sStack_2360;
      secp256k1_ecmult_strauss_wnaf(&sStack_2378,r,1,r,&secp256k1_scalar_zero,psVar14);
    }
    else {
      if ((b == (secp256k1_ge *)0x0) ||
         (sVar7 = secp256k1_pippenger_max_points
                            ((secp256k1_callback *)psVar13,(secp256k1_scratch *)b), sVar7 == 0)) {
LAB_0014df51:
        secp256k1_ecmult_multi_simple_var(r,psVar14,cb,cbdata,(size_t)hash);
        return;
      }
      uVar4 = 5000000;
      if (sVar7 < 5000000) {
        uVar4 = sVar7;
      }
      puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
      uStack_2380 = (ulong)puVar1 / uVar4 + 1;
      uVar4 = (ulong)puVar1 / uStack_2380;
      if (uVar4 < 0x57) {
        lVar3 = 0;
        do {
          if (*(char *)((long)(b->x).n + lVar3) != "scratch"[lVar3]) {
            (*(code *)(psVar13->x).n[0])("invalid scratch space",(psVar13->x).n[1]);
            goto LAB_0014df51;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 8);
        uVar8 = (b->x).n[3] - (b->x).n[2];
        uVar4 = 0;
        if (0x4a < uVar8) {
          uVar4 = uVar8 - 0x4b;
        }
        if (uVar4 < 0x988) goto LAB_0014df51;
        uVar4 = uVar4 / 0x988;
        if (4999999 < uVar4) {
          uVar4 = 5000000;
        }
        uStack_2380 = (ulong)puVar1 / uVar4 + 1;
        uVar4 = (ulong)puVar1 / uStack_2380;
        pcVar5 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar5 = secp256k1_ecmult_pippenger_batch;
      }
      psVar15 = (secp256k1_sha256 *)(uVar4 + 1);
      lVar3 = 0;
      uVar4 = 0;
      do {
        psVar10 = psVar15;
        if (hash < psVar15) {
          psVar10 = hash;
        }
        psVar6 = (secp256k1_ge *)0x0;
        if (uVar4 == 0) {
          psVar6 = (secp256k1_ge *)psVar14;
        }
        iVar2 = (*pcVar5)(psVar13,b,&sStack_2360,psVar6,cb,cbdata,psVar10,lVar3);
        if (iVar2 == 0) {
          return;
        }
        secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_2360,(secp256k1_fe *)0x0);
        hash = (secp256k1_sha256 *)((long)hash - (long)psVar10);
        uVar4 = uVar4 + 1;
        lVar3 = (long)psVar15->s + lVar3;
      } while (uStack_2380 != uVar4);
    }
  }
  return;
}

Assistant:

static void test_ecmult_target(const secp256k1_scalar* target, int mode) {
    /* Mode: 0=ecmult_gen, 1=ecmult, 2=ecmult_const */
    secp256k1_scalar n1, n2;
    secp256k1_ge p;
    secp256k1_gej pj, p1j, p2j, ptj;

    /* Generate random n1,n2 such that n1+n2 = -target. */
    testutil_random_scalar_order_test(&n1);
    secp256k1_scalar_add(&n2, &n1, target);
    secp256k1_scalar_negate(&n2, &n2);

    /* Generate a random input point. */
    if (mode != 0) {
        testutil_random_ge_test(&p);
        secp256k1_gej_set_ge(&pj, &p);
    }

    /* EC multiplications */
    if (mode == 0) {
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p1j, &n1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p2j, &n2);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &ptj, target);
    } else if (mode == 1) {
        secp256k1_ecmult(&p1j, &pj, &n1, &secp256k1_scalar_zero);
        secp256k1_ecmult(&p2j, &pj, &n2, &secp256k1_scalar_zero);
        secp256k1_ecmult(&ptj, &pj, target, &secp256k1_scalar_zero);
    } else {
        secp256k1_ecmult_const(&p1j, &p, &n1);
        secp256k1_ecmult_const(&p2j, &p, &n2);
        secp256k1_ecmult_const(&ptj, &p, target);
    }

    /* Add them all up: n1*P + n2*P + target*P = (n1+n2+target)*P = (n1+n1-n1-n2)*P = 0. */
    secp256k1_gej_add_var(&ptj, &ptj, &p1j, NULL);
    secp256k1_gej_add_var(&ptj, &ptj, &p2j, NULL);
    CHECK(secp256k1_gej_is_infinity(&ptj));
}